

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_mem_pool_test.c
# Opt level: O2

int main(void)

{
  long lVar1;
  void *pvVar2;
  long lVar3;
  int iVar4;
  char *pcVar5;
  void *p [20];
  
  _mpp_log_l(4,"mpp_mem_pool_test","mpp_mem_pool_test start\n",0);
  lVar1 = mpp_mem_pool_init_f("main",0x400);
  if (lVar1 == 0) {
    pcVar5 = "mpp_mem_pool_test mpp_mem_pool_init failed\n";
LAB_0010123d:
    _mpp_log_l(2,"mpp_mem_pool_test",pcVar5,0);
    iVar4 = -1;
    pcVar5 = "mpp_mem_pool_test failed\n";
LAB_0010125e:
    _mpp_log_l(4,"mpp_mem_pool_test",pcVar5,0);
    return iVar4;
  }
  lVar3 = 0;
  pcVar5 = "mpp_mem_pool_test mpp_mem_pool_get failed\n";
LAB_001011c0:
  if (lVar3 != 0x14) goto code_r0x001011c6;
  for (lVar3 = 0; lVar3 != 10; lVar3 = lVar3 + 1) {
    if (p[lVar3] != (void *)0x0) {
      mpp_mem_pool_put_f("main",lVar1);
      p[lVar3] = (void *)0x0;
    }
  }
  lVar3 = 0;
  do {
    if (lVar3 == 5) {
      iVar4 = 0;
      pcVar5 = "mpp_mem_pool_test success\n";
      for (lVar3 = 0; lVar3 != 0x14; lVar3 = lVar3 + 1) {
        if (p[lVar3] != (void *)0x0) {
          mpp_mem_pool_put_f("main",lVar1);
          p[lVar3] = (void *)0x0;
        }
      }
      goto LAB_0010125e;
    }
    pvVar2 = (void *)mpp_mem_pool_get_f("main",lVar1);
    p[lVar3] = pvVar2;
    lVar3 = lVar3 + 1;
  } while (pvVar2 != (void *)0x0);
  goto LAB_0010123d;
code_r0x001011c6:
  pvVar2 = (void *)mpp_mem_pool_get_f("main",lVar1);
  p[lVar3] = pvVar2;
  lVar3 = lVar3 + 1;
  if (pvVar2 == (void *)0x0) goto LAB_0010123d;
  goto LAB_001011c0;
}

Assistant:

int main()
{
    MppMemPool pool = NULL;
    size_t size = MPP_MEM_POOL_TEST_SIZE;
    void *p [MPP_MEM_POOL_TEST_COUNT];
    RK_U32 i;

    mpp_log("mpp_mem_pool_test start\n");

    pool = mpp_mem_pool_init(size);
    if (NULL == pool) {
        mpp_err("mpp_mem_pool_test mpp_mem_pool_init failed\n");
        goto mpp_mem_pool_test_failed;
    }

    for (i = 0; i < MPP_MEM_POOL_TEST_COUNT; i++) {
        p[i] = mpp_mem_pool_get(pool);
        if (!p[i]) {
            mpp_err("mpp_mem_pool_test mpp_mem_pool_get failed\n");
            goto mpp_mem_pool_test_failed;
        }
    }

    for (i = 0; i < MPP_MEM_POOL_TEST_COUNT / 2; i++) {
        if (p[i]) {
            mpp_mem_pool_put(pool, p[i]);
            p[i] = NULL;
        }
    }

    for (i = 0; i < MPP_MEM_POOL_TEST_COUNT / 4; i++) {
        p[i] = mpp_mem_pool_get(pool);
        if (!p[i]) {
            mpp_err("mpp_mem_pool_test mpp_mem_pool_get failed\n");
            goto mpp_mem_pool_test_failed;
        }
    }

    for (i = 0; i < MPP_MEM_POOL_TEST_COUNT; i++) {
        if (p[i]) {
            mpp_mem_pool_put(pool, p[i]);
            p[i] = NULL;
        }
    }

    mpp_log("mpp_mem_pool_test success\n");
    return MPP_OK;

mpp_mem_pool_test_failed:
    mpp_log("mpp_mem_pool_test failed\n");
    return MPP_NOK;
}